

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O1

void Output::SkipToColumn(size_t column)

{
  char *pcVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_t sVar4;
  ulong *puVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_0155fcc8);
  if (*pcVar1 == '\x01') {
    plVar2 = (long *)__tls_get_addr(&PTR_0155fc78);
    lVar7 = *plVar2;
    puVar3 = (undefined8 *)__tls_get_addr(&PTR_0155fb58);
    sVar4 = PAL_wcslen((char16_t *)*puVar3);
    uVar8 = sVar4 + lVar7;
  }
  else {
    uVar8 = 0;
  }
  puVar5 = (ulong *)__tls_get_addr(&PTR_0155fb78);
  uVar6 = 0;
  if (uVar8 <= *puVar5) {
    uVar6 = *puVar5 - uVar8;
  }
  lVar7 = column - uVar6;
  bVar9 = lVar7 != 0;
  if (column < uVar6 || !bVar9) {
    Print(L" ");
    return;
  }
  while (bVar9) {
    Print(L" ");
    lVar7 = lVar7 + -1;
    bVar9 = lVar7 != 0;
  }
  return;
}

Assistant:

void
Output::SkipToColumn(size_t column)
{
    size_t columnbias = 0;
    // If we're using a custom alignment and prefix, we want to do this relative to that
    if (usingCustomAlignAndPrefix)
    {
        // If we've already added the alignment and prefix, we need to add the alignment to our column number here
        columnbias = align + wcslen(prefix);
    }
    size_t reference = 0;
    if (Output::s_Column > columnbias)
    {
        reference = Output::s_Column - columnbias;
    }
    if (column <= reference)
    {
        Output::Print(_u(" "));
        return;
    }

    // compute distance to our destination

    size_t dist = column - reference;

    // Print at least one space
    while (dist > 0)
    {
        Output::Print(_u(" "));
        dist--;
    }
}